

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::oper_rhs<int>(Opers t_oper,Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  Common_Types CVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  type tVar4;
  Boxed_Value BVar5;
  Boxed_Value *unaff_retaddr;
  undefined4 in_stack_00000008;
  Opers in_stack_0000000c;
  Boxed_Value *in_stack_00000010;
  undefined4 in_stack_00000018;
  Opers in_stack_0000001c;
  Boxed_Value *in_stack_00000020;
  undefined4 in_stack_00000038;
  Boxed_Value *in_stack_00000040;
  Opers in_stack_0000004c;
  element_type *t_rhs_00;
  
  t_rhs_00 = in_RDI;
  CVar1 = get_common_type((Boxed_Value *)in_RDI);
  switch(CVar1) {
  case t_int32:
    tVar4 = go<int,int>(t_rhs._4_4_,in_stack_00000020,
                        (Boxed_Value *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_double:
    tVar4 = go<int,double>(in_stack_0000001c,in_stack_00000010,
                           (Boxed_Value *)CONCAT44(in_stack_0000000c,in_stack_00000008));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint8:
    tVar4 = go<int,unsigned_char>
                      (t_rhs._4_4_,in_stack_00000020,
                       (Boxed_Value *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int8:
    tVar4 = go<int,signed_char>(t_rhs._4_4_,in_stack_00000020,
                                (Boxed_Value *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint16:
    tVar4 = go<int,unsigned_short>
                      (t_rhs._4_4_,in_stack_00000020,
                       (Boxed_Value *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int16:
    tVar4 = go<int,short>(t_rhs._4_4_,in_stack_00000020,
                          (Boxed_Value *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint32:
    tVar4 = go<int,unsigned_int>
                      (t_rhs._4_4_,in_stack_00000020,
                       (Boxed_Value *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint64:
    tVar4 = go<int,unsigned_long>
                      (in_stack_0000004c,in_stack_00000040,
                       (Boxed_Value *)CONCAT44(t_oper,in_stack_00000038));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int64:
    tVar4 = go<int,long>(in_stack_0000004c,in_stack_00000040,
                         (Boxed_Value *)CONCAT44(t_oper,in_stack_00000038));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_float:
    tVar4 = go<int,float>(in_stack_0000000c,unaff_retaddr,(Boxed_Value *)t_rhs_00);
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_long_double:
    tVar4 = go<int,long_double>(in_stack_0000004c,in_stack_00000040,
                                (Boxed_Value *)CONCAT44(t_oper,in_stack_00000038));
    _Var3._M_pi = tVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast((bad_any_cast *)in_RDI);
    __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static Boxed_Value oper_rhs(Operators::Opers t_oper, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs)
        {
          switch (get_common_type(t_rhs)) {
            case Common_Types::t_int32:
              return go<LHS, int32_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint8:
              return go<LHS, uint8_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_int8:
              return go<LHS, int8_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint16:
              return go<LHS, uint16_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_int16:
              return go<LHS, int16_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint32:
              return go<LHS, uint32_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint64:
              return go<LHS, uint64_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_int64:
              return go<LHS, int64_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_double:
              return go<LHS, double>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_float:
              return go<LHS, float>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_long_double:
              return go<LHS, long double>(t_oper, t_lhs, t_rhs);
          }

          throw chaiscript::detail::exception::bad_any_cast();
        }